

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

void __thiscall cppcms::session_interface::validate_request_origin(session_interface *this)

{
  bool bVar1;
  byte bVar2;
  level_type lVar3;
  undefined8 uVar4;
  request *prVar5;
  session_interface *this_00;
  difference_type dVar6;
  pointer ppVar7;
  ostream *poVar8;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pair;
  string token;
  request *in_stack_fffffffffffffd88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffd98;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  in_stack_fffffffffffffda0;
  request *in_stack_fffffffffffffdd0;
  string *token_00;
  string local_190 [39];
  byte local_169;
  string local_168 [39];
  byte local_141;
  string local_140 [39];
  byte local_119;
  message local_118 [48];
  undefined1 local_e8 [55];
  undefined1 local_b1 [33];
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_90;
  string local_80 [32];
  string local_60 [35];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  if (*(long *)(in_RDI + 0x60) == 0) {
    local_3d = 1;
    uVar4 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_28,"request origin validation isn\'t possible without http::context",&local_29)
    ;
    cppcms_error::cppcms_error
              ((cppcms_error *)in_stack_fffffffffffffd90,(string *)in_stack_fffffffffffffd88);
    local_3d = 0;
    __cxa_throw(uVar4,&cppcms_error::typeinfo,cppcms_error::~cppcms_error);
  }
  if ((*(uint *)(in_RDI + 0x80) >> 5 & 1) != 0) {
    return;
  }
  *(uint *)(in_RDI + 0x80) = *(uint *)(in_RDI + 0x80) & 0xffffffdf | 0x20;
  if ((*(uint *)(in_RDI + 0x80) >> 7 & 1) == 0) {
    return;
  }
  if ((*(uint *)(in_RDI + 0x80) >> 6 & 1) == 0) {
    return;
  }
  http::context::request((context *)0x43f275);
  http::request::request_method_abi_cxx11_(in_stack_fffffffffffffd88);
  bVar1 = std::operator!=(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
  std::__cxx11::string::~string(local_60);
  if (bVar1) {
    return;
  }
  std::__cxx11::string::string(local_80);
  prVar5 = http::context::request((context *)0x43f30d);
  this_00 = (session_interface *)http::request::post_abi_cxx11_(prVar5);
  token_00 = (string *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b1 + 1),"_csrf",(allocator *)token_00);
  local_90 = std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::equal_range((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffd90,(key_type *)in_stack_fffffffffffffd88);
  std::__cxx11::string::~string((string *)(local_b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b1);
  bVar1 = std::operator!=(&local_90.first,&local_90.second);
  if (bVar1) {
    local_e8._40_8_ = local_90.first._M_node;
    local_e8._32_8_ = local_90.second._M_node;
    dVar6 = std::
            distance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    if (dVar6 == 1) {
      ppVar7 = std::
               _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)0x43f442);
      std::__cxx11::string::operator=(local_80,(string *)&ppVar7->second);
      goto LAB_0043f51a;
    }
  }
  prVar5 = http::context::request((context *)0x43f4d0);
  http::request::getenv_abi_cxx11_((request *)local_e8,(char *)prVar5);
  std::__cxx11::string::operator=(local_80,(string *)local_e8);
  std::__cxx11::string::~string((string *)local_e8);
LAB_0043f51a:
  bVar1 = validate_csrf_token(this_00,token_00);
  if (bVar1) {
    std::__cxx11::string::~string(local_80);
    return;
  }
  local_119 = 0;
  local_141 = 0;
  local_169 = 0;
  lVar3 = booster::log::logger::instance();
  bVar2 = booster::log::logger::should_be_logged(lVar3,(char *)0x28);
  if ((bVar2 & 1) != 0) {
    booster::log::message::message
              (local_118,warning,"cppcms",
               "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/src/session_interface.cpp"
               ,0x90);
    local_119 = 1;
    poVar8 = (ostream *)booster::log::message::out();
    poVar8 = std::operator<<(poVar8,"CSRF validation failed");
    poVar8 = std::operator<<(poVar8," IP=");
    in_stack_fffffffffffffdd0 = http::context::request((context *)0x43f61d);
    http::request::remote_addr_abi_cxx11_(in_stack_fffffffffffffd88);
    local_141 = 1;
    poVar8 = std::operator<<(poVar8,local_140);
    poVar8 = std::operator<<(poVar8," SCRIPT_NAME=");
    http::context::request((context *)0x43f682);
    http::request::script_name_abi_cxx11_(in_stack_fffffffffffffd88);
    local_169 = 1;
    poVar8 = std::operator<<(poVar8,local_168);
    poVar8 = std::operator<<(poVar8," PATH_INFO=");
    http::context::request((context *)0x43f6e7);
    http::request::path_info_abi_cxx11_(in_stack_fffffffffffffd88);
    poVar8 = std::operator<<(poVar8,local_190);
    std::ios::operator_cast_to_bool(poVar8 + *(long *)(*(long *)poVar8 + -0x18));
    std::__cxx11::string::~string(local_190);
  }
  if ((local_169 & 1) != 0) {
    std::__cxx11::string::~string(local_168);
  }
  if ((local_141 & 1) != 0) {
    std::__cxx11::string::~string(local_140);
  }
  if ((local_119 & 1) != 0) {
    booster::log::message::~message(local_118);
  }
  uVar4 = __cxa_allocate_exception(0x30);
  request_forgery_error::request_forgery_error((request_forgery_error *)in_stack_fffffffffffffdd0);
  __cxa_throw(uVar4,&request_forgery_error::typeinfo,request_forgery_error::~request_forgery_error);
}

Assistant:

void session_interface::validate_request_origin()
{
	if(!context_)
		throw cppcms_error("request origin validation isn't possible without http::context");
	if(csrf_checked_)
		return;
	csrf_checked_ = 1;

	if(!csrf_validation_)
		return;
	if(!csrf_do_validation_)
		return;
	if(context_->request().request_method()!="POST")
		return;
	
	std::string token;
	
	typedef http::request::form_type::const_iterator iterator_type;
	std::pair<iterator_type,iterator_type> pair=context_->request().post().equal_range("_csrf");

	if(pair.first != pair.second && std::distance(pair.first,pair.second)==1)
		token = pair.first->second;
	else
		token = context_->request().getenv("HTTP_X_CSRFTOKEN");
	
	if(!validate_csrf_token(token)) {
		BOOSTER_WARNING("cppcms")	<<"CSRF validation failed"
						<<" IP="<< context_->request().remote_addr() 
						<<" SCRIPT_NAME=" << context_->request().script_name() 
						<<" PATH_INFO="<<context_->request().path_info();  
		throw request_forgery_error();
	}
}